

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

int secp256k1_ecdsa_sig_verify
              (secp256k1_scalar *sigr,secp256k1_scalar *sigs,secp256k1_ge *pubkey,
              secp256k1_scalar *message)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 in_EAX;
  uint uVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej pr;
  secp256k1_gej pubkeyj;
  secp256k1_fe xr;
  secp256k1_fe aux [8];
  uchar c [32];
  secp256k1_strauss_state local_9b0;
  secp256k1_scalar local_998;
  secp256k1_scalar local_978;
  secp256k1_scalar local_958;
  secp256k1_gej local_938;
  undefined1 local_8b8 [104];
  undefined1 local_850 [16];
  int local_840;
  secp256k1_strauss_point_state local_838;
  secp256k1_fe local_428 [8];
  secp256k1_ge local_2e8 [8];
  
  auVar6._0_4_ = -(uint)((int)sigr->d[2] == 0 && (int)sigr->d[0] == 0);
  auVar6._4_4_ = -(uint)(*(int *)((long)sigr->d + 0x14) == 0 && *(int *)((long)sigr->d + 4) == 0);
  auVar6._8_4_ = -(uint)((int)sigr->d[3] == 0 && (int)sigr->d[1] == 0);
  auVar6._12_4_ = -(uint)(*(int *)((long)sigr->d + 0x1c) == 0 && *(int *)((long)sigr->d + 0xc) == 0)
  ;
  uVar3 = movmskps(in_EAX,auVar6);
  if (((uVar3 ^ 0xf) == 0) ||
     (auVar7._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0),
     auVar7._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0)
     , auVar7._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0),
     auVar7._12_4_ =
          -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0),
     iVar4 = movmskps(uVar3 ^ 0xf,auVar7), iVar4 == 0xf)) {
    return 0;
  }
  secp256k1_scalar_inverse_var(&local_958,sigs);
  secp256k1_scalar_mul(&local_978,&local_958,message);
  secp256k1_scalar_mul(&local_998,&local_958,sigr);
  local_840 = pubkey->infinity;
  local_8b8._0_8_ = (pubkey->x).n[0];
  local_8b8._8_8_ = (pubkey->x).n[1];
  local_8b8._16_8_ = (pubkey->x).n[2];
  local_8b8._24_8_ = (pubkey->x).n[3];
  local_8b8._32_8_ = (pubkey->x).n[4];
  local_8b8._40_8_ = (pubkey->y).n[0];
  local_8b8._48_8_ = (pubkey->y).n[1];
  local_8b8._56_8_ = (pubkey->y).n[2];
  local_8b8._64_8_ = (pubkey->y).n[3];
  local_8b8._72_8_ = (pubkey->y).n[4];
  local_8b8._80_8_ = 1;
  local_8b8._88_16_ = (undefined1  [16])0x0;
  local_850 = (undefined1  [16])0x0;
  local_9b0.aux = local_428;
  local_9b0.pre_a = local_2e8;
  local_9b0.ps = &local_838;
  secp256k1_ecmult_strauss_wnaf
            (&local_9b0,&local_938,1,(secp256k1_gej *)local_8b8,&local_998,&local_978);
  if (local_938.infinity == 0) {
    secp256k1_scalar_get_b32((uchar *)local_2e8,sigr);
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)&local_838,(uchar *)local_2e8);
    iVar4 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_838,&local_938);
    if (iVar4 != 0) {
      return 1;
    }
    uVar3 = 4;
    do {
      uVar1 = secp256k1_ecdsa_const_p_minus_order.n[uVar3];
      uVar2 = *(ulong *)(local_838.wnaf_na_1 + (ulong)uVar3 * 2);
      if (uVar2 >= uVar1 && uVar2 != uVar1) {
        return 0;
      }
      if (uVar2 < uVar1) {
        local_838.wnaf_na_1._0_8_ = local_838.wnaf_na_1._0_8_ + 0x25e8cd0364141;
        local_838.wnaf_na_1._8_8_ = local_838.wnaf_na_1._8_8_ + 0xe6af48a03bbfd;
        local_838.wnaf_na_1._16_8_ = local_838.wnaf_na_1._16_8_ + 0xffffffebaaedc;
        local_838.wnaf_na_1._24_8_ = local_838.wnaf_na_1._24_8_ + 0xfffffffffffff;
        local_838.wnaf_na_1._32_8_ = local_838.wnaf_na_1._32_8_ + 0xffffffffffff;
        iVar4 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_838,&local_938);
        return iVar4;
      }
      bVar5 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar5);
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_is_zero(const secp256k1_scalar *a) {
    SECP256K1_SCALAR_VERIFY(a);

    return (a->d[0] | a->d[1] | a->d[2] | a->d[3]) == 0;
}